

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O1

void voc_push_toklist(voccxdef *ctx,char **wordlist,int cnt)

{
  uint16_t tmp;
  uint uVar1;
  size_t sVar2;
  uchar *puVar3;
  ulong uVar4;
  long lVar5;
  uint lstsiz;
  char *pcVar6;
  
  if (cnt < 1) {
    lstsiz = 0;
  }
  else {
    lVar5 = 0;
    lstsiz = 0;
    do {
      pcVar6 = wordlist[lVar5];
      if (*pcVar6 == '\"') {
        uVar1 = (uint)*(ushort *)(pcVar6 + 1);
      }
      else {
        sVar2 = strlen(pcVar6);
        uVar1 = (uint)sVar2;
      }
      lstsiz = lstsiz + uVar1 + 3;
      lVar5 = lVar5 + 1;
    } while (cnt != (int)lVar5);
  }
  puVar3 = voc_push_list_siz(ctx,lstsiz);
  if (0 < cnt) {
    lVar5 = 0;
    do {
      *puVar3 = '\x03';
      pcVar6 = wordlist[lVar5];
      if (*pcVar6 == '\"') {
        uVar4 = (ulong)*(ushort *)(pcVar6 + 1);
        pcVar6 = pcVar6 + 3;
        sVar2 = uVar4 - 2;
      }
      else {
        uVar4 = strlen(pcVar6);
        sVar2 = uVar4;
      }
      *(short *)(puVar3 + 1) = (short)uVar4 + 2;
      if (*wordlist[lVar5] == '\"') {
        puVar3[3] = '\"';
        puVar3 = puVar3 + 4;
      }
      else {
        puVar3 = puVar3 + 3;
      }
      memcpy(puVar3,pcVar6,sVar2);
      puVar3 = puVar3 + sVar2;
      if (*wordlist[lVar5] == '\"') {
        *puVar3 = '\"';
        puVar3 = puVar3 + 1;
      }
      lVar5 = lVar5 + 1;
    } while (cnt != (int)lVar5);
  }
  return;
}

Assistant:

static void voc_push_toklist(voccxdef *ctx, char *wordlist[], int cnt)
{
    int i;
    char **p;
    uint lstsiz;
    uchar *lstp;
    size_t cur_len;

    /* 
     *   Add up the lengths of the strings in the array.  For each
     *   element, we need space for the string's bytes, plus two bytes for
     *   the length prefix, plus one byte for the type prefix.  
     */
    for (lstsiz = 0, p = wordlist, i = 0 ; i < cnt ; ++i, ++p)
    {
        /* 
         *   get the length of the current token - check what kind of
         *   token we have, since we must sense the length of different
         *   token types in different ways 
         */
        if (**p == '"')
        {
            /* 
             *   It's a string token - the string follows with a two-byte
             *   length prefix; add two bytes for the open and close quote
             *   characters that we'll add to the output string.  Note
             *   that we must deduct two bytes from the prefix length,
             *   because the prefix includes the size of the prefix
             *   itself, which we're not copying and will account for
             *   separately in the result string.
             */
            cur_len = osrp2(*p + 1) - 2 + 2;
        }
        else
        {
            /* for anything else, it's just a null-terminated string */
            cur_len = strlen(*p);
        }

        /* add the current length to the total so far */
        lstsiz += cur_len + 3;
    }

    /* allocate space for the list */
    lstp = voc_push_list_siz(ctx, lstsiz);

    /* enter the list elements */
    for (p = wordlist, i = 0 ; i < cnt ; ++i, ++p)
    {
        char *cur_ptr;
        size_t copy_len;
        
        /* add the type prefix */
        *lstp++ = DAT_SSTRING;

        /* get the information for the string based on the type */
        if (**p == '"')
        {
            /* 
             *   it's a string - use the length prefix (deducting two
             *   bytes for the prefix itself, which we're not copying) 
             */
            copy_len = osrp2(*p + 1) - 2;

            /* add space in the result for the open and close quotes */
            cur_len = copy_len + 2;

            /* the string itself follows the length prefix and '"' flag */
            cur_ptr = *p + 3;
        }
        else
        {
            /* for anything else, it's just a null-terminated string */
            cur_len = copy_len = strlen(*p);
            cur_ptr = *p;
        }

        /* write the length prefix for this string */
        oswp2(lstp, cur_len + 2);
        lstp += 2;

        /* add the open quote if this is a quoted string */
        if (**p == '"')
            *lstp++ = '"';

        /* add this string */
        memcpy(lstp, cur_ptr, copy_len);
        lstp += copy_len;

        /* add the close quote if it's a quoted string */
        if (**p == '"')
            *lstp++ = '"';
    }
}